

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageSizeTests.cpp
# Opt level: O0

string * __thiscall
glcts::(anonymous_namespace)::ImageSizeMachine::GenShader<tcu::Vector<float,4>>
          (string *__return_storage_ptr__,ImageSizeMachine *this,int stage)

{
  ostream *poVar1;
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [48];
  undefined1 local_198 [8];
  ostringstream os;
  int stage_local;
  ImageSizeMachine *this_local;
  
  os._372_4_ = stage;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::operator<<((ostream *)local_198,"\n#define KSIZE 4");
  if (os._372_4_ == 0) {
    std::operator<<((ostream *)local_198,"\nflat out ivec4 count[KSIZE];");
  }
  else {
    std::operator<<((ostream *)local_198,
                    "\nlayout(std430) buffer OutputBuffer {\n  ivec4 count[KSIZE];\n};");
  }
  poVar1 = std::operator<<((ostream *)local_198,"\nlayout(binding = 0, rgba32");
  ImageFormatPostfix<tcu::Vector<float,4>>();
  poVar1 = std::operator<<(poVar1,local_1c8);
  poVar1 = std::operator<<(poVar1,") readonly writeonly uniform highp ");
  ImageTypePrefix<tcu::Vector<float,4>>();
  poVar1 = std::operator<<(poVar1,local_1e8);
  poVar1 = std::operator<<(poVar1,"image2D g_image_2d;\nlayout(binding = 1, rgba32");
  ImageFormatPostfix<tcu::Vector<float,4>>();
  poVar1 = std::operator<<(poVar1,local_208);
  poVar1 = std::operator<<(poVar1,") readonly writeonly uniform highp ");
  ImageTypePrefix<tcu::Vector<float,4>>();
  poVar1 = std::operator<<(poVar1,local_228);
  poVar1 = std::operator<<(poVar1,"image3D g_image_3d;\nlayout(binding = 2, rgba32");
  ImageFormatPostfix<tcu::Vector<float,4>>();
  poVar1 = std::operator<<(poVar1,local_248);
  poVar1 = std::operator<<(poVar1,") readonly writeonly uniform highp ");
  ImageTypePrefix<tcu::Vector<float,4>>();
  poVar1 = std::operator<<(poVar1,local_268);
  poVar1 = std::operator<<(poVar1,"imageCube g_image_cube;\nlayout(binding = 3, rgba32");
  ImageFormatPostfix<tcu::Vector<float,4>>();
  poVar1 = std::operator<<(poVar1,local_288);
  poVar1 = std::operator<<(poVar1,") readonly writeonly uniform highp ");
  ImageTypePrefix<tcu::Vector<float,4>>();
  poVar1 = std::operator<<(poVar1,local_2a8);
  std::operator<<(poVar1,"image2DArray g_image_2d_array;");
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::~string(local_268);
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string(local_228);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_1c8);
  if (os._372_4_ == 0) {
    std::operator<<((ostream *)local_198,
                    "\nvoid main() {\n  int coord = gl_VertexID;\n#ifdef GL_ES\n  gl_PointSize = 1.0;\n#endif"
                   );
  }
  else if (os._372_4_ == 4) {
    std::operator<<((ostream *)local_198,
                    "\nlayout(local_size_x = 1) in;\nvoid main() {\n  int coord = int(gl_GlobalInvocationID.x);"
                   );
  }
  else if (os._372_4_ == 5) {
    std::operator<<((ostream *)local_198,
                    "\nuniform int fakePrimitiveID;\nvoid main() {\n  int coord = fakePrimitiveID;")
    ;
  }
  std::operator<<((ostream *)local_198,
                  "\n  count[coord + 0] = ivec4(imageSize(g_image_2d), 0, 0);\n  count[coord + 1] = ivec4(imageSize(g_image_3d), 0);\n  count[coord + 2] = ivec4(imageSize(g_image_cube), 0, 0);\n  count[coord + 3] = ivec4(imageSize(g_image_2d_array), 0);\n}"
                 );
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string GenShader(int stage)
	{
		std::ostringstream os;
		os << NL "#define KSIZE 4";
		if (stage == 0)
		{ // VS uses transform feedback
			os << NL "flat out ivec4 count[KSIZE];";
		}
		else
		{ // CS + FS use SSBO
			os << NL "layout(std430) buffer OutputBuffer {" NL "  ivec4 count[KSIZE];" NL "};";
		}
		os << NL "layout(binding = 0, rgba32" << ImageFormatPostfix<T>() << ") readonly writeonly uniform highp "
		   << ImageTypePrefix<T>() << "image2D g_image_2d;" NL "layout(binding = 1, rgba32" << ImageFormatPostfix<T>()
		   << ") readonly writeonly uniform highp " << ImageTypePrefix<T>()
		   << "image3D g_image_3d;" NL "layout(binding = 2, rgba32" << ImageFormatPostfix<T>()
		   << ") readonly writeonly uniform highp " << ImageTypePrefix<T>()
		   << "imageCube g_image_cube;" NL "layout(binding = 3, rgba32" << ImageFormatPostfix<T>()
		   << ") readonly writeonly uniform highp " << ImageTypePrefix<T>() << "image2DArray g_image_2d_array;";
		if (stage == 0)
		{ // VS
			os << NL "void main() {" NL "  int coord = gl_VertexID;" NL "#ifdef GL_ES" NL "  gl_PointSize = 1.0;" NL
					 "#endif";
		}
		else if (stage == 4)
		{ // CS
			os << NL "layout(local_size_x = 1) in;" NL "void main() {" NL "  int coord = int(gl_GlobalInvocationID.x);";
		}
		else if (stage == 5)
		{ // FS
			os << NL "uniform int fakePrimitiveID;" NL "void main() {" NL "  int coord = fakePrimitiveID;";
		}
		os << NL "  count[coord + 0] = ivec4(imageSize(g_image_2d), 0, 0);" NL
				 "  count[coord + 1] = ivec4(imageSize(g_image_3d), 0);" NL
				 "  count[coord + 2] = ivec4(imageSize(g_image_cube), 0, 0);" NL
				 "  count[coord + 3] = ivec4(imageSize(g_image_2d_array), 0);" NL "}";
		return os.str();
	}